

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O3

bool anon_unknown.dwarf_2052c5::checkPixels<Imath_3_2::half>
               (Array2D<unsigned_int> *sampleCount,Array2D<Imath_3_2::half_*> *ph,int lx,int rx,
               int ly,int ry,int width)

{
  uint uVar1;
  char cVar2;
  bool bVar3;
  ostream *poVar4;
  long *plVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  uint uVar9;
  float fVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  float fVar14;
  
  bVar3 = true;
  if (ly <= ry) {
    bVar3 = false;
    lVar13 = (long)ly;
    do {
      if (lx <= rx) {
        lVar11 = (long)lx;
        do {
          if ((ulong)sampleCount->_data[sampleCount->_sizeY * lVar13 + lVar11] != 0) {
            iVar12 = ((int)lVar13 * width + (int)lVar11) % 0x801;
            fVar14 = (float)iVar12;
            uVar7 = (uint)fVar14 & 0x7fffff | 0x800000;
            cVar2 = (char)((uint)fVar14 >> 0x17);
            fVar10 = ABS(fVar14);
            uVar6 = (uint)fVar14 >> 0x10 & 0x8000;
            uVar9 = (uint)fVar14 >> 0xd & 0x3ff;
            uVar1 = uVar6 + 0x7c00;
            if ((uint)fVar10 < 0x477ff000) {
              uVar1 = (int)fVar10 + 0x8000fff + (uint)(((uint)fVar10 >> 0xd & 1) != 0) >> 0xd |
                      uVar6;
            }
            uVar9 = uVar9 == 0 | uVar9;
            if (fVar10 == INFINITY) {
              uVar9 = 0;
            }
            uVar9 = uVar6 + 0x7c00 + uVar9;
            if ((uint)fVar10 < 0x7f800000) {
              uVar9 = uVar1;
            }
            uVar1 = (uint)(0x80000000 < uVar7 << (cVar2 + 0xa2U & 0x1f)) +
                    (uVar7 >> (0x7eU - cVar2 & 0x1f) | uVar6);
            if ((uint)fVar10 < 0x33000001) {
              uVar1 = uVar6;
            }
            if (0x387fffff < (uint)fVar10) {
              uVar1 = uVar9;
            }
            fVar10 = *(float *)(_imath_half_to_float_table + ((ulong)uVar1 & 0xffff) * 4);
            uVar8 = 0;
            do {
              fVar14 = *(float *)(_imath_half_to_float_table +
                                 (ulong)ph->_data[ph->_sizeY * lVar13 + lVar11][uVar8]._h * 4);
              if ((fVar14 != fVar10) || (NAN(fVar14) || NAN(fVar10))) {
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)&std::cout,"value at ",9);
                poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar11);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
                poVar4 = (ostream *)std::ostream::operator<<(poVar4,(int)lVar13);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", sample ",9);
                poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,": ",2);
                poVar4 = (ostream *)
                         ::operator<<(poVar4,(half)ph->_data[lVar13 * ph->_sizeY + lVar11][uVar8]._h
                                     );
                std::__ostream_insert<char,std::char_traits<char>>(poVar4,", should be ",0xc);
                plVar5 = (long *)std::ostream::operator<<(poVar4,iVar12);
                std::ios::widen((char)*(undefined8 *)(*plVar5 + -0x18) + (char)plVar5);
                std::ostream::put((char)plVar5);
                std::ostream::flush();
                std::ostream::flush();
                return bVar3;
              }
              uVar8 = uVar8 + 1;
            } while (sampleCount->_data[sampleCount->_sizeY * lVar13 + lVar11] != uVar8);
          }
          lVar11 = lVar11 + 1;
        } while (rx + 1 != (int)lVar11);
      }
      lVar11 = lVar13 + 1;
      bVar3 = ry <= lVar13;
      lVar13 = lVar11;
    } while (ry + 1 != (int)lVar11);
  }
  return bVar3;
}

Assistant:

bool
checkPixels (
    Array2D<unsigned int>& sampleCount,
    Array2D<T*>&           ph,
    int                    lx,
    int                    rx,
    int                    ly,
    int                    ry,
    int                    width)
{
    for (int y = ly; y <= ry; ++y)
    {
        for (int x = lx; x <= rx; ++x)
        {
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                if (ph[y][x][i] != static_cast<T> (((y * width + x) % 2049)))
                {
                    cout << "value at " << x << ", " << y << ", sample " << i
                         << ": " << ph[y][x][i] << ", should be "
                         << (y * width + x) % 2049 << endl
                         << flush;
                    return false;
                }
            }
        }
    }

    return true;
}